

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::IndexOfHelper<true>(Arguments *args,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  JavascriptBoolean *pJVar2;
  code *pcVar3;
  unsigned_long fromIndex_00;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  Var pvVar9;
  uint64 uVar10;
  TypedArrayBase *pArr_00;
  uint64 toIndex;
  JavascriptBoolean *pJVar11;
  JavascriptNativeIntArray *pArr_01;
  JavascriptNativeFloatArray *pArr_02;
  undefined4 *puVar12;
  unsigned_long local_88;
  uint64 fromIndex64;
  RecyclableObject *obj;
  BigIndex length;
  JavascriptArray *pArr;
  JsReentLock jsReentLock;
  Var search;
  uint32 fromIndex;
  
  pArr = (JavascriptArray *)scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)pArr)->noJsReentrancy;
  ((ThreadContext *)pArr)->noJsReentrancy = true;
  pvVar9 = Arguments::operator[](args,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&pArr,pvVar9);
  fromIndex64 = 0;
  length.bigIndex = 0;
  BigIndex::BigIndex((BigIndex *)&obj,0);
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pJVar2 = (pJVar1->super_JavascriptLibraryBase).booleanTrue.ptr;
  pJVar11 = (pJVar1->super_JavascriptLibraryBase).booleanFalse.ptr;
  *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
  pvVar9 = Arguments::operator[](args,0);
  TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
            (pvVar9,scriptContext,L"Array.prototype.indexOf",(JavascriptArray **)&length.bigIndex,
             (RecyclableObject **)&fromIndex64,(BigIndex *)&obj);
  JsReentLock::MutateArrayObject((JsReentLock *)&pArr);
  *(undefined1 *)&pArr[4].head.ptr = 1;
  search._4_4_ = 0;
  local_88 = 0;
  if ((length.bigIndex != 0) ||
     (bVar4 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)fromIndex64), bVar4)) {
    if (length._0_8_ != 0xffffffff && (int)obj == -1) goto LAB_00a591c7;
    if ((int)obj == -1 && length._0_8_ == 0xffffffff) {
      uVar7 = 0xffffffff;
    }
    else {
      uVar7 = BigIndex::GetSmallIndex((BigIndex *)&obj);
    }
    *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
    BVar5 = GetParamForIndexOf<unsigned_int>
                      (uVar7,args,(Var *)&jsReentLock.m_savedNoJsReentrancy,
                       (uint *)((long)&search + 4),scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)&pArr);
  }
  else if ((int)obj == -1) {
LAB_00a591c7:
    *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
    uVar10 = BigIndex::GetBigIndex((BigIndex *)&obj);
    BVar5 = GetParamForIndexOf<unsigned_long>
                      (uVar10,args,(Var *)&jsReentLock.m_savedNoJsReentrancy,&local_88,scriptContext
                      );
    JsReentLock::MutateArrayObject((JsReentLock *)&pArr);
  }
  else {
    *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
    uVar6 = BigIndex::GetSmallIndex((BigIndex *)&obj);
    BVar5 = GetParamForIndexOf<unsigned_int>
                      (uVar6,args,(Var *)&jsReentLock.m_savedNoJsReentrancy,
                       (uint *)((long)&search + 4),scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)&pArr);
  }
  *(undefined1 *)&pArr[4].head.ptr = 1;
  if (BVar5 != 0) {
    if (length.bigIndex != 0) {
      bVar4 = IsNonES5Array((Var)fromIndex64);
      if (bVar4) {
        if ((length.bigIndex != 0) && (length._0_8_ == 0xffffffff || (int)obj != -1)) {
          if ((int)obj == -1 && length._0_8_ == 0xffffffff) {
            uVar7 = 0xffffffff;
          }
          else {
            uVar7 = BigIndex::GetSmallIndex((BigIndex *)&obj);
          }
          *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
          iVar8 = (**(code **)(*(long *)length.bigIndex + 0x3c0))
                            (length.bigIndex,jsReentLock._24_8_,(long)&search + 4,uVar7,1,
                             scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)&pArr);
          *(undefined1 *)&pArr[4].head.ptr = 1;
          if (search._4_4_ == 0xffffffff || iVar8 != -1) {
            if (iVar8 != -1) {
              pJVar11 = pJVar2;
            }
          }
          else {
            iVar8 = **(int **)(length.bigIndex + 8);
            if (iVar8 == 0x20) {
              *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
              pArr_02 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>
                                  ((JavascriptArray *)length.bigIndex);
              pJVar11 = (JavascriptBoolean *)
                        TemplatedIndexOfHelper<true,Js::JavascriptNativeFloatArray,unsigned_int>
                                  (pArr_02,(Var)jsReentLock._24_8_,search._4_4_,uVar7,scriptContext)
              ;
            }
            else if (iVar8 == 0x1e) {
              *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
              pArr_01 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>
                                  ((JavascriptArray *)length.bigIndex);
              pJVar11 = (JavascriptBoolean *)
                        TemplatedIndexOfHelper<true,Js::JavascriptNativeIntArray,unsigned_int>
                                  (pArr_01,(Var)jsReentLock._24_8_,search._4_4_,uVar7,scriptContext)
              ;
            }
            else if (iVar8 == 0x1d) {
              *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
              pJVar11 = (JavascriptBoolean *)
                        TemplatedIndexOfHelper<true,Js::JavascriptArray,unsigned_int>
                                  ((JavascriptArray *)length.bigIndex,(Var)jsReentLock._24_8_,
                                   search._4_4_,uVar7,scriptContext);
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar12 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0xfab,"(0)","invalid array typeid");
              if (!bVar4) goto LAB_00a5954f;
              *puVar12 = 0;
              *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
              pJVar11 = (JavascriptBoolean *)
                        TemplatedIndexOfHelper<true,Js::JavascriptArray,unsigned_int>
                                  ((JavascriptArray *)length.bigIndex,(Var)jsReentLock._24_8_,
                                   search._4_4_,uVar7,scriptContext);
            }
          }
          goto LAB_00a593be;
        }
      }
      else {
        bVar4 = VarIsImpl<Js::ES5Array>((RecyclableObject *)fromIndex64);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0xf86,"(VarIs<ES5Array>(obj))",
                                      "The array should have been converted to an ES5Array");
          if (!bVar4) {
LAB_00a5954f:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar12 = 0;
        }
        length.bigIndex = 0;
      }
    }
    uVar10 = fromIndex64;
    bVar4 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)fromIndex64);
    if ((bVar4) &&
       (pArr_00 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)uVar10),
       uVar7 = search._4_4_, pArr_00 != (TypedArrayBase *)0x0)) {
      if (((int)obj != -1) || (length._0_8_ == 0xffffffff)) {
        *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
        uVar6 = BigIndex::GetSmallIndex((BigIndex *)&obj);
        pJVar11 = (JavascriptBoolean *)
                  TemplatedIndexOfHelper<true,Js::TypedArrayBase,unsigned_int>
                            (pArr_00,(Var)jsReentLock._24_8_,uVar7,uVar6,scriptContext);
        goto LAB_00a593be;
      }
    }
    else {
      uVar7 = search._4_4_;
      uVar10 = fromIndex64;
      if ((int)obj != -1) {
        *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
        uVar6 = BigIndex::GetSmallIndex((BigIndex *)&obj);
        pJVar11 = (JavascriptBoolean *)
                  TemplatedIndexOfHelper<true,Js::RecyclableObject,unsigned_int>
                            ((RecyclableObject *)uVar10,(Var)jsReentLock._24_8_,uVar7,uVar6,
                             scriptContext);
        goto LAB_00a593be;
      }
    }
    uVar10 = fromIndex64;
    fromIndex_00 = local_88;
    *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
    toIndex = BigIndex::GetBigIndex((BigIndex *)&obj);
    pJVar11 = (JavascriptBoolean *)
              TemplatedIndexOfHelper<true,Js::RecyclableObject,unsigned_long>
                        ((RecyclableObject *)uVar10,(Var)jsReentLock._24_8_,fromIndex_00,toIndex,
                         scriptContext);
  }
LAB_00a593be:
  *(undefined1 *)&pArr[4].head.ptr = jsReentLock.m_arrayObject2._0_1_;
  return pJVar11;
}

Assistant:

Var JavascriptArray::IndexOfHelper(Arguments const & args, ScriptContext *scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        RecyclableObject* obj = nullptr;
        JavascriptArray* pArr = nullptr;
        BigIndex length;
        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.indexOf"), &pArr, &obj, &length));
        Var search;
        uint32 fromIndex = 0;
        uint64 fromIndex64 = 0;

        // The evaluation of method arguments may change the type of the array. Hence, we do that prior to the actual helper method calls.
        // The if clause of the conditional statement below applies to an JavascriptArray or TypedArray instances. The rest of the conditional
        // clauses apply to an ES5Array or other valid Javascript objects.
        if ((pArr || VarIs<TypedArrayBase>(obj)) && (length.IsSmallIndex() || length.IsUint32Max()))
        {
            uint32 len = length.IsUint32Max() ? MaxArrayLength : length.GetSmallIndex();
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(len, args, search, fromIndex, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }
        else if (length.IsSmallIndex())
        {
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(length.GetSmallIndex(), args, search, fromIndex, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }
        else
        {
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(length.GetBigIndex(), args, search, fromIndex64, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of fromIndex argument may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            if (length.IsSmallIndex() || length.IsUint32Max())
            {
                uint32 len = length.IsUint32Max() ? MaxArrayLength : length.GetSmallIndex();
                JS_REENTRANT(jsReentLock, int32 index = pArr->HeadSegmentIndexOfHelper(search, fromIndex, len, includesAlgorithm, scriptContext));

                // If we found the search value in the head segment, or if we determined there is no need to search other segments,
                // we stop right here.
                if (index != -1 || fromIndex == -1)
                {
                    if (includesAlgorithm)
                    {
                        //Array.prototype.includes
                        return (index == -1) ? falseValue : trueValue;
                    }
                    else
                    {
                        //Array.prototype.indexOf
                        return JavascriptNumber::ToVar(index, scriptContext);
                    }
                }

                //  If we really must search other segments, let's do it now. We'll have to search the slow way (dealing with holes, etc.).
                switch (pArr->GetTypeId())
                {
                case Js::TypeIds_Array:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(pArr, search, fromIndex, len, scriptContext));
                case Js::TypeIds_NativeIntArray:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(UnsafeVarTo<JavascriptNativeIntArray>(pArr), search, fromIndex, len, scriptContext));
                case Js::TypeIds_NativeFloatArray:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(UnsafeVarTo<JavascriptNativeFloatArray>(pArr), search, fromIndex, len, scriptContext));
                default:
                    AssertMsg(FALSE, "invalid array typeid");
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(pArr, search, fromIndex, len, scriptContext));
                }
            }
        }

        // source object is not a JavascriptArray but source could be a TypedArray
        TypedArrayBase * typedArrayObj = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(obj);
        if (typedArrayObj)
        {
            if (length.IsSmallIndex() || length.IsUint32Max())
            {
                JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(typedArrayObj, search, fromIndex, length.GetSmallIndex(), scriptContext));
            }
        }
        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(obj, search, fromIndex, length.GetSmallIndex(), scriptContext));
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(obj, search, fromIndex64, length.GetBigIndex(), scriptContext));
        }
    }